

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_shaders.cxx
# Opt level: O2

void __thiscall
xray_re::xr_level_shaders::load(xr_level_shaders *this,uint32_t xrlc_version,xr_reader *r)

{
  uint __line;
  xr_reader *s;
  
  s = (xr_reader *)0x0;
  if (xrlc_version == 5) {
    s = xr_reader::open_chunk(r,3);
    if (s == (xr_reader *)0x0) {
      __line = 0x5a;
    }
    else {
      load_shaders_v5(this,s);
      xr_reader::close_chunk(r,&s);
      s = xr_reader::open_chunk(r,2);
      if (s != (xr_reader *)0x0) {
        load_textures_v5(this,s);
        goto LAB_0015e63b;
      }
      __line = 0x5e;
    }
LAB_0015e6b4:
    s = (xr_reader *)0x0;
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_shaders.cxx"
                  ,__line,"void xray_re::xr_level_shaders::load(uint32_t, xr_reader &)");
  }
  if ((xrlc_version & 0xfffffffc) == 8) {
    s = xr_reader::open_chunk(r,2);
    if (s == (xr_reader *)0x0) {
      __line = 0x62;
      goto LAB_0015e6b4;
    }
    load_v8(this,s);
  }
  else if (0xb < xrlc_version) {
    s = xr_reader::open_chunk(r,2);
    if (s == (xr_reader *)0x0) {
      __line = 0x66;
      goto LAB_0015e6b4;
    }
    load_v13(this,s);
  }
LAB_0015e63b:
  xr_reader::close_chunk(r,&s);
  return;
}

Assistant:

void xr_level_shaders::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5) {
		s = r.open_chunk(FSL5_SHADERS);
		xr_assert(s);
		load_shaders_v5(*s);
		r.close_chunk(s);
		s = r.open_chunk(FSL5_TEXTURES);
		xr_assert(s);
		load_textures_v5(*s);
	} else if (xrlc_version >= XRLC_VERSION_8 && xrlc_version <= XRLC_VERSION_11) {
		s = r.open_chunk(FSL8_SHADERS);
		xr_assert(s);
		load_v8(*s);
	} else if (xrlc_version >= XRLC_VERSION_12) {
		s = r.open_chunk(FSL13_SHADERS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}